

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O0

int wally_hash160(uchar *bytes,size_t bytes_len,uchar *bytes_out,size_t len)

{
  int iVar1;
  _Bool aligned;
  ripemd160 ripemd;
  uchar buff [32];
  size_t len_local;
  uchar *bytes_out_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if ((bytes_out == (uchar *)0x0) || (len != 0x14)) {
    bytes_local._4_4_ = -2;
  }
  else {
    iVar1 = wally_sha256(bytes,bytes_len,ripemd.u.u8 + 0xc,0x20);
    if (iVar1 == 0) {
      ripemd160((ripemd160 *)bytes_out,(void *)((long)&ripemd.u + 0xc),0x20);
      wally_clear((void *)((long)&ripemd.u + 0xc),0x20);
      bytes_local._4_4_ = 0;
    }
    else {
      bytes_local._4_4_ = -2;
    }
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_hash160(const unsigned char *bytes, size_t bytes_len,
                  unsigned char *bytes_out, size_t len)
{
    unsigned char buff[SHA256_LEN];
    struct ripemd160 ripemd;
    const bool aligned = alignment_ok(bytes_out, sizeof(ripemd.u.u32));

    if (!bytes_out || len != HASH160_LEN)
        return WALLY_EINVAL;

    BUILD_ASSERT(sizeof(ripemd) == HASH160_LEN);

    if (wally_sha256(bytes, bytes_len, buff, sizeof(buff)) != WALLY_OK)
        return WALLY_EINVAL;

    ripemd160(aligned ? (struct ripemd160 *)bytes_out : &ripemd, &buff, sizeof(buff));
    if (!aligned) {
        memcpy(bytes_out, &ripemd, sizeof(ripemd));
        wally_clear(&ripemd, sizeof(ripemd));
    }
    wally_clear(&buff, sizeof(buff));
    return WALLY_OK;
}